

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef::~IfcRectangleHollowProfileDef
          (IfcRectangleHollowProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcRectangleHollowProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef,_3UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleHollowProfileDef,_3UL> *)
             &(this->super_IfcRectangleProfileDef).field_0x90,vtt + 0x10);
  IfcRectangleProfileDef::~IfcRectangleProfileDef(&this->super_IfcRectangleProfileDef,vtt + 1);
  return;
}

Assistant:

IfcRectangleHollowProfileDef() : Object("IfcRectangleHollowProfileDef") {}